

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayoutPrivate::deleteAll(QGridLayoutPrivate *this)

{
  bool bVar1;
  value_type pQVar2;
  long in_RDI;
  QGridBox *in_stack_ffffffffffffffe0;
  void *pvVar3;
  
  while (bVar1 = QList<QGridBox_*>::isEmpty((QList<QGridBox_*> *)0x331088),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar2 = QList<QGridBox_*>::takeFirst((QList<QGridBox_*> *)in_stack_ffffffffffffffe0);
    if (pQVar2 != (value_type)0x0) {
      QGridBox::~QGridBox(in_stack_ffffffffffffffe0);
      operator_delete(pQVar2,0x18);
    }
  }
  pvVar3 = *(void **)(in_RDI + 0xe8);
  if (pvVar3 != (void *)0x0) {
    QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x3310e8);
    operator_delete(pvVar3,0x18);
  }
  return;
}

Assistant:

void QGridLayoutPrivate::deleteAll()
{
    while (!things.isEmpty())
        delete things.takeFirst();
    delete hfwData;
}